

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_cdef_mt_dealloc(AV1CdefSync *cdef_sync)

{
  if (cdef_sync->mutex_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)cdef_sync->mutex_);
    aom_free(cdef_sync->mutex_);
    return;
  }
  return;
}

Assistant:

void av1_cdef_mt_dealloc(AV1CdefSync *cdef_sync) {
  (void)cdef_sync;
  assert(cdef_sync != NULL);
#if CONFIG_MULTITHREAD
  if (cdef_sync->mutex_ != NULL) {
    pthread_mutex_destroy(cdef_sync->mutex_);
    aom_free(cdef_sync->mutex_);
  }
#endif  // CONFIG_MULTITHREAD
}